

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QGesture*,QPointer<QWidget>>::emplaceValue<QPointer<QWidget>const&>
          (Node<QGesture_*,_QPointer<QWidget>_> *this,QPointer<QWidget> *args)

{
  QPointer<QWidget> *in_RDI;
  long in_FS_OFFSET;
  QPointer<QWidget> *this_00;
  QPointer<QWidget> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_18;
  QPointer<QWidget>::QPointer(this_00,in_RDI);
  QPointer<QWidget>::operator=(this_00,in_RDI);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x32f619);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }